

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_16x8(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  
  uVar17 = (ulong)start_col;
  for (lVar24 = 0; lVar24 != 0x40; lVar24 = lVar24 + 8) {
    lVar33 = *(long *)((long)sample_data + lVar24);
    bVar1 = *(byte *)(lVar33 + 0xf + uVar17);
    uVar25 = (ulong)((uint)*(byte *)(lVar33 + uVar17) + (uint)bVar1);
    bVar2 = *(byte *)(lVar33 + 1 + uVar17);
    bVar3 = *(byte *)(lVar33 + 0xe + uVar17);
    uVar38 = (ulong)((uint)bVar2 + (uint)bVar3);
    bVar4 = *(byte *)(lVar33 + 2 + uVar17);
    bVar5 = *(byte *)(lVar33 + 6 + uVar17);
    bVar6 = *(byte *)(lVar33 + 9 + uVar17);
    uVar29 = (ulong)((uint)bVar5 + (uint)bVar6);
    bVar7 = *(byte *)(lVar33 + 7 + uVar17);
    bVar8 = *(byte *)(lVar33 + 8 + uVar17);
    uVar19 = (ulong)((uint)bVar7 + (uint)bVar8);
    lVar22 = uVar19 + uVar25;
    lVar34 = uVar25 - uVar19;
    lVar23 = uVar29 + uVar38;
    lVar39 = uVar38 - uVar29;
    bVar9 = *(byte *)(lVar33 + 0xd + uVar17);
    uVar19 = (ulong)((uint)bVar4 + (uint)bVar9);
    bVar10 = *(byte *)(lVar33 + 5 + uVar17);
    bVar11 = *(byte *)(lVar33 + 10 + uVar17);
    uVar25 = (ulong)((uint)bVar10 + (uint)bVar11);
    lVar28 = uVar19 + uVar25;
    lVar27 = uVar19 - uVar25;
    bVar12 = *(byte *)(lVar33 + 3 + uVar17);
    bVar13 = *(byte *)(lVar33 + 0xc + uVar17);
    uVar25 = (ulong)((uint)bVar12 + (uint)bVar13);
    bVar14 = *(byte *)(lVar33 + 4 + uVar17);
    bVar15 = *(byte *)(lVar33 + 0xb + uVar17);
    uVar19 = (ulong)((uint)bVar14 + (uint)bVar15);
    lVar31 = uVar19 + uVar25;
    lVar37 = uVar25 - uVar19;
    lVar35 = (ulong)*(byte *)(lVar33 + uVar17) - (ulong)bVar1;
    lVar33 = (ulong)bVar2 - (ulong)bVar3;
    lVar26 = (ulong)bVar4 - (ulong)bVar9;
    lVar21 = (ulong)bVar12 - (ulong)bVar13;
    lVar20 = (ulong)bVar14 - (ulong)bVar15;
    lVar30 = (ulong)bVar10 - (ulong)bVar11;
    lVar36 = (ulong)bVar5 - (ulong)bVar6;
    lVar32 = (ulong)bVar7 - (ulong)bVar8;
    data[lVar24] = ((int)lVar22 + (int)lVar23 + (int)lVar28 + (int)lVar31) * 4 + -0x2000;
    data[lVar24 + 4] =
         (DCTELEM)((lVar23 - lVar28) * 0x1151 + (lVar22 - lVar31) * 0x29cf + 0x400U >> 0xb);
    lVar22 = (lVar34 - lVar27) * 0x2c63 + (lVar37 - lVar39) * 0x8d4;
    data[lVar24 + 2] = (DCTELEM)((ulong)(lVar27 * 0x4587 + lVar22 + 0x400 + lVar39 * 0x2e75) >> 0xb)
    ;
    data[lVar24 + 6] =
         (DCTELEM)((ulong)(lVar22 + lVar37 * 0x7ffffffde07 + 0x400 + lVar34 * 0x7fffffff93e) >> 0xb)
    ;
    lVar27 = (lVar36 - lVar32) * 0xd23 + (lVar33 + lVar35) * 0x2b4e;
    lVar23 = (lVar32 + lVar30) * 0x1555 + (lVar26 + lVar35) * 0x27e9;
    lVar28 = (lVar20 - lVar32) * 0x1cb6 + (lVar21 + lVar35) * 0x22fc;
    lVar34 = (lVar36 - lVar30) * 0x2d09 + (lVar26 + lVar33) * 0x470;
    lVar22 = (lVar36 + lVar20) * -0x27e9 + (lVar21 + lVar33) * -0x1555;
    lVar31 = (lVar30 - lVar20) * 0xd23 + (lVar21 + lVar26) * -0x2b4e;
    data[lVar24 + 1] =
         (DCTELEM)(lVar32 * 0x18f3 + lVar35 * 0x7ffffffb6d6 + lVar23 + lVar27 + lVar28 + 0x400U >>
                  0xb);
    data[lVar24 + 3] =
         (DCTELEM)(lVar27 + lVar34 + lVar36 * 0x7ffffffcac1 + lVar33 * 0x24d + lVar22 + 0x400U >>
                  0xb);
    data[lVar24 + 5] =
         (DCTELEM)((ulong)(lVar30 * 0x2747 + lVar34 + lVar26 * -0x2406 + lVar31 + 0x400 + lVar23) >>
                  0xb);
    data[lVar24 + 7] =
         (DCTELEM)((ulong)(lVar20 * 0x4560 + lVar22 + lVar21 * 0x2218 + lVar31 + 0x400 + lVar28) >>
                  0xb);
  }
  for (iVar18 = 7; -1 < iVar18; iVar18 = iVar18 + -1) {
    iVar16 = *data;
    lVar33 = (long)(data[0x38] + iVar16);
    lVar31 = (long)(data[0x30] + data[8]);
    lVar23 = (long)(data[0x28] + data[0x10]);
    lVar22 = (long)(data[0x18] + data[0x20]);
    lVar24 = lVar22 + lVar33;
    lVar33 = lVar33 - lVar22;
    lVar22 = lVar31 + lVar23;
    lVar31 = lVar31 - lVar23;
    *data = (int)(lVar22 + lVar24 + 4U >> 3);
    lVar21 = (long)(iVar16 - data[0x38]);
    lVar20 = (long)(data[8] - data[0x30]);
    lVar28 = (long)(data[0x10] - data[0x28]);
    lVar23 = (long)(data[0x18] - data[0x20]);
    data[0x20] = (int)((lVar24 - lVar22) + 4U >> 3);
    lVar24 = (lVar33 + lVar31) * 0x1151;
    data[0x10] = (int)((ulong)(lVar33 * 0x187e + lVar24 + 0x8000) >> 0x10);
    data[0x30] = (int)((ulong)(lVar24 + lVar31 * 0xffffffffc4df + 0x8000) >> 0x10);
    lVar22 = (lVar23 + lVar20 + lVar28 + lVar21) * 0x25a1;
    lVar24 = (lVar28 + lVar21) * -0xc7c + lVar22;
    lVar22 = (lVar23 + lVar20) * -0x3ec5 + lVar22;
    lVar31 = (lVar23 + lVar21) * -0x1ccd;
    data[8] = (int)((ulong)(lVar21 * 0x300b + lVar31 + 0x8000 + lVar24) >> 0x10);
    lVar33 = (lVar28 + lVar20) * -0x5203;
    data[0x18] = (int)((ulong)(lVar20 * 0x6254 + lVar33 + 0x8000 + lVar22) >> 0x10);
    data[0x28] = (int)((ulong)(lVar28 * 0x41b3 + lVar33 + 0x8000 + lVar24) >> 0x10);
    data[0x38] = (int)((ulong)(lVar23 * 0x98e + lVar31 + 0x8000 + lVar22) >> 0x10);
    data = data + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_16x8 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16, tmp17;
  INT32 z1;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* 16-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/32). */

  dataptr = data;
  ctr = 0;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[15]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[14]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[13]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[12]);
    tmp4 = GETJSAMPLE(elemptr[4]) + GETJSAMPLE(elemptr[11]);
    tmp5 = GETJSAMPLE(elemptr[5]) + GETJSAMPLE(elemptr[10]);
    tmp6 = GETJSAMPLE(elemptr[6]) + GETJSAMPLE(elemptr[9]);
    tmp7 = GETJSAMPLE(elemptr[7]) + GETJSAMPLE(elemptr[8]);

    tmp10 = tmp0 + tmp7;
    tmp14 = tmp0 - tmp7;
    tmp11 = tmp1 + tmp6;
    tmp15 = tmp1 - tmp6;
    tmp12 = tmp2 + tmp5;
    tmp16 = tmp2 - tmp5;
    tmp13 = tmp3 + tmp4;
    tmp17 = tmp3 - tmp4;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[15]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[14]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[13]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[12]);
    tmp4 = GETJSAMPLE(elemptr[4]) - GETJSAMPLE(elemptr[11]);
    tmp5 = GETJSAMPLE(elemptr[5]) - GETJSAMPLE(elemptr[10]);
    tmp6 = GETJSAMPLE(elemptr[6]) - GETJSAMPLE(elemptr[9]);
    tmp7 = GETJSAMPLE(elemptr[7]) - GETJSAMPLE(elemptr[8]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 + tmp12 + tmp13 - 16 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(1.306562965)) + /* c4[16] = c2[8] */
	      MULTIPLY(tmp11 - tmp12, FIX_0_541196100),   /* c12[16] = c6[8] */
	      CONST_BITS-PASS1_BITS);

    tmp10 = MULTIPLY(tmp17 - tmp15, FIX(0.275899379)) +   /* c14[16] = c7[8] */
	    MULTIPLY(tmp14 - tmp16, FIX(1.387039845));    /* c2[16] = c1[8] */

    dataptr[2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp15, FIX(1.451774982))   /* c6+c14 */
	      + MULTIPLY(tmp16, FIX(2.172734804)),        /* c2+c10 */
	      CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(0.211164243))   /* c2-c6 */
	      - MULTIPLY(tmp17, FIX(1.061594338)),        /* c10+c14 */
	      CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp11 = MULTIPLY(tmp0 + tmp1, FIX(1.353318001)) +         /* c3 */
	    MULTIPLY(tmp6 - tmp7, FIX(0.410524528));          /* c13 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.247225013)) +         /* c5 */
	    MULTIPLY(tmp5 + tmp7, FIX(0.666655658));          /* c11 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(1.093201867)) +         /* c7 */
	    MULTIPLY(tmp4 - tmp7, FIX(0.897167586));          /* c9 */
    tmp14 = MULTIPLY(tmp1 + tmp2, FIX(0.138617169)) +         /* c15 */
	    MULTIPLY(tmp6 - tmp5, FIX(1.407403738));          /* c1 */
    tmp15 = MULTIPLY(tmp1 + tmp3, - FIX(0.666655658)) +       /* -c11 */
	    MULTIPLY(tmp4 + tmp6, - FIX(1.247225013));        /* -c5 */
    tmp16 = MULTIPLY(tmp2 + tmp3, - FIX(1.353318001)) +       /* -c3 */
	    MULTIPLY(tmp5 - tmp4, FIX(0.410524528));          /* c13 */
    tmp10 = tmp11 + tmp12 + tmp13 -
	    MULTIPLY(tmp0, FIX(2.286341144)) +                /* c7+c5+c3-c1 */
	    MULTIPLY(tmp7, FIX(0.779653625));                 /* c15+c13-c11+c9 */
    tmp11 += tmp14 + tmp15 + MULTIPLY(tmp1, FIX(0.071888074)) /* c9-c3-c15+c11 */
	     - MULTIPLY(tmp6, FIX(1.663905119));              /* c7+c13+c1-c5 */
    tmp12 += tmp14 + tmp16 - MULTIPLY(tmp2, FIX(1.125726048)) /* c7+c5+c15-c3 */
	     + MULTIPLY(tmp5, FIX(1.227391138));              /* c9-c11+c1-c13 */
    tmp13 += tmp15 + tmp16 + MULTIPLY(tmp3, FIX(1.065388962)) /* c15+c3+c11-c7 */
	     + MULTIPLY(tmp4, FIX(2.167985692));              /* c1+c13+c5-c9 */

    dataptr[1] = (DCTELEM) DESCALE(tmp10, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp11, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp12, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp13, CONST_BITS-PASS1_BITS);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by 8/16 = 1/2.
   */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + dataptr[DCTSIZE*4];

    tmp10 = tmp0 + tmp3;
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] - dataptr[DCTSIZE*4];

    dataptr[DCTSIZE*0] = (DCTELEM) DESCALE(tmp10 + tmp11, PASS1_BITS+1);
    dataptr[DCTSIZE*4] = (DCTELEM) DESCALE(tmp10 - tmp11, PASS1_BITS+1);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    dataptr[DCTSIZE*2] = (DCTELEM) DESCALE(z1 + MULTIPLY(tmp12, FIX_0_765366865),
					   CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*6] = (DCTELEM) DESCALE(z1 - MULTIPLY(tmp13, FIX_1_847759065),
					   CONST_BITS+PASS1_BITS+1);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * 8-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp0 + tmp10 + tmp12,
					   CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp1 + tmp11 + tmp13,
					   CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp2 + tmp11 + tmp12,
					   CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp3 + tmp10 + tmp13,
					   CONST_BITS+PASS1_BITS+1);

    dataptr++;			/* advance pointer to next column */
  }
}